

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O2

void __thiscall BigInteger::_divide_by_2(BigInteger *this)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  
  puVar2 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar5 = 0;
  for (puVar4 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish; puVar4 != puVar2; puVar4 = puVar4 + -1) {
    uVar1 = puVar4[-1];
    uVar6 = uVar1 >> 1;
    uVar7 = uVar6 + 500000000;
    if (bVar5 == 0) {
      uVar7 = uVar6;
    }
    puVar4[-1] = uVar7;
    bVar5 = (byte)uVar1 & 1;
  }
  puVar2 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    puVar3 = puVar4 + -1;
    if (puVar4 == puVar2) {
LAB_0011dd41:
      this->negative = false;
      return;
    }
    if (*puVar3 != 0) {
      if (puVar4 != puVar2) {
        return;
      }
      goto LAB_0011dd41;
    }
    (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
    puVar4 = puVar3;
  } while( true );
}

Assistant:

void BigInteger::_divide_by_2() noexcept
{
    bool carry = false;
    for(auto i = digits.rbegin(); i != digits.rend(); ++i)
    {
        if(carry)
        {
            carry = *i % 2;
            *i = *i / 2 + BLOCK_MOD / 2;
        }
        else
        {
            carry = *i % 2;
            *i /= 2;
        }
    }
    normalize();
}